

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall IR::Instr::FetchOperands(Instr *this,Opnd **argsOpnd,uint argsOpndLength)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  ArgSlot AVar5;
  undefined4 *puVar6;
  SymOpnd *pSVar7;
  StackSym *pSVar8;
  Opnd *this_00;
  ulong uVar9;
  
  if (this->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                       "this->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_00481de2;
    *puVar6 = 0;
  }
  pSVar7 = Opnd::AsSymOpnd(this->m_src2);
  pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
  pIVar1 = (pSVar8->field_5).m_instrDef;
  if (pIVar1->m_opcode != ArgOut_A_InlineSpecialized) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                       "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
    if (!bVar3) {
LAB_00481de2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this_00 = pIVar1->m_src2;
  pSVar7 = Opnd::AsSymOpnd(this_00);
  pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
  AVar5 = StackSym::GetArgSlotNum(pSVar8);
  uVar9 = (ulong)AVar5;
  if (AVar5 == argsOpndLength) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      uVar9 = uVar9 - 1;
      bVar4 = Opnd::IsSymOpnd(this_00);
      bVar3 = uVar9 != 0xffffffffffffffff && bVar4;
      if (uVar9 == 0xffffffffffffffff || !bVar4) break;
      pSVar7 = Opnd::AsSymOpnd(this_00);
      pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
      if ((pSVar8->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar4) goto LAB_00481de2;
        *puVar6 = 0;
      }
      pIVar1 = (pSVar8->field_5).m_instrDef;
      if (pIVar1->m_opcode != ArgOut_A) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                           "argInstr->m_opcode == Js::OpCode::ArgOut_A");
        if (!bVar4) goto LAB_00481de2;
        *puVar6 = 0;
      }
      argsOpnd[uVar9 & 0xffffffff] = pIVar1->m_src1;
      if ((uVar9 & 0xffffffff) == 0) {
        return bVar3;
      }
      this_00 = pIVar1->m_src2;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
Instr::FetchOperands(_Out_writes_(argsOpndLength) IR::Opnd **argsOpnd, uint argsOpndLength)
{
    return this->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
    {
        argsOpnd[argNum] = argOutInstr->GetSrc1();
        return argNum == 0;
    }, argsOpndLength);
}